

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_write.c
# Opt level: O1

void vid_ULA(ubyte iobyte)

{
  ubyte uVar1;
  ubyte uVar2;
  bool bVar3;
  
  uVar1 = vid_con_reg;
  vid_con_reg = iobyte;
  if (((iobyte & 2) == 0) && (teletext != '\0')) {
    teletext = '\0';
    pixel_vid_init();
  }
  if (((iobyte & 2) != 0) && (teletext == '\0')) {
    teletext = '\x01';
    teletext_init();
  }
  uVar2 = (ubyte)(0x5028140a >> (vid_con_reg * '\x02' & 0x18));
  bVar3 = disp_chars != uVar2;
  disp_chars = uVar2;
  if (bVar3) {
    set_colour_bits();
  }
  if ((((uVar1 ^ vid_con_reg) & 1) != 0) && (teletext == '\0')) {
    flash();
    return;
  }
  return;
}

Assistant:

void vid_ULA(ubyte iobyte)      // Video ULA control register
{
    ubyte tempbits;
    ubyte flashstate;

    flashstate = vid_con_reg & 1;       // initial flash state
    vid_con_reg = iobyte;             // update control register

    if (!(iobyte & 2) && teletext)      // if 1-0 transition on the teletext select
    {                               // initialise graphics
        teletext = 0;
        pixel_vid_init();
    }

    if ((iobyte & 2) && (!teletext))    // if 0-1 transition on the teletext select
    {                               // initialise teletext
        teletext = 1;
        teletext_init();
    }

    tempbits = disp_chars;            // initial number of display characters

    switch (vid_con_reg & 0xC) {
        case 0x00:
            disp_chars = 10;
            break;
        case 0x04:
            disp_chars = 20;
            break;
        case 0x08:
            disp_chars = 40;
            break;
        case 0x0C:
            disp_chars = 80;
            break;
    }

    // if displayed characters change, set_colour_bits()
    if (tempbits != disp_chars) set_colour_bits();
    // if flash state has changed, flash()
    if ((flashstate != (vid_con_reg & 1)) && (!teletext)) flash();

}